

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

BOOL __thiscall
Js::GlobalObject::SetExistingProperty
          (GlobalObject *this,PropertyId propertyId,Var value,PropertyValueInfo *info,
          BOOL *setAttempted)

{
  HostObjectBase *pHVar1;
  PropertyQueryFlags PVar2;
  BOOL BVar3;
  int iVar4;
  RecyclableObject *pRVar5;
  bool bVar6;
  
  PVar2 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,(PropertyValueInfo *)0x0)
  ;
  bVar6 = PVar2 == Property_Found;
  pRVar5 = RecyclableObject::GetPrototype((RecyclableObject *)this);
  BVar3 = JavascriptOperators::HasProperty(pRVar5,propertyId);
  *setAttempted = 1;
  pRVar5 = (this->directHostObject).ptr;
  if (((BVar3 != 0 || bVar6) || pRVar5 == (RecyclableObject *)0x0) ||
     (iVar4 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xb])(pRVar5,(ulong)(uint)propertyId,0), iVar4 != 1)) {
    pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
    if ((pHVar1 != (HostObjectBase *)0x0 && (BVar3 == 0 && !bVar6)) &&
       (iVar4 = (**(code **)(*(long *)pHVar1 + 0x58))(pHVar1,propertyId,0), iVar4 == 1)) {
      pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
      BVar3 = (**(code **)(*(long *)pHVar1 + 0xb8))(pHVar1,propertyId,value,0,0);
      return BVar3;
    }
  }
  else {
    pRVar5 = (this->directHostObject).ptr;
    iVar4 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x17])(pRVar5,(ulong)(uint)propertyId,value,0,info);
    if (iVar4 != 0) {
      return 1;
    }
  }
  if (BVar3 == 0 && !bVar6) {
    *setAttempted = 0;
    return 0;
  }
  BVar3 = DynamicObject::SetProperty
                    ((DynamicObject *)this,propertyId,value,PropertyOperation_None,info);
  return BVar3;
}

Assistant:

BOOL GlobalObject::SetExistingProperty(PropertyId propertyId, Var value, PropertyValueInfo* info, BOOL *setAttempted)
    {
        BOOL hasOwnProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, nullptr /*info*/));
        BOOL hasProperty = JavascriptOperators::HasProperty(this->GetPrototype(), propertyId);
        *setAttempted = TRUE;

        if (this->directHostObject &&
            !hasOwnProperty &&
            !hasProperty &&
            this->directHostObject->HasProperty(propertyId))
        {
            // directHostObject->HasProperty returns true for things in global collections, however, they are not able to be set.
            // When we call SetProperty we'll return FALSE which means fall back to GlobalObject::SetProperty and shadow our collection
            // object rather than failing the set altogether. See bug Windows Out Of Band Releases 1144780 and linked bugs for details.
            if (this->directHostObject->SetProperty(propertyId, value, PropertyOperation_None, info))
            {
                return TRUE;
            }
        }
        else
            if (this->hostObject &&
                // Consider to revert to the commented line and ignore the prototype chain when direct host is on by default in IE9 mode
                !hasOwnProperty &&
                !hasProperty &&
                this->hostObject->HasProperty(propertyId))
            {
                return this->hostObject->SetProperty(propertyId, value, PropertyOperation_None, NULL);
            }

        if (hasOwnProperty || hasProperty)
        {
            return DynamicObject::SetProperty(propertyId, value, PropertyOperation_None, info);
        }

        *setAttempted = FALSE;
        return FALSE;
    }